

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t ZSTD_buildCTable(void *dst,size_t dstCapacity,FSE_CTable *nextCTable,U32 FSELog,
                       symbolEncodingType_e type,uint *count,U32 max,BYTE *codeTable,size_t nbSeq,
                       S16 *defaultNorm,U32 defaultNormLog,U32 defaultMax,FSE_CTable *prevCTable,
                       size_t prevCTableSize,void *entropyWorkspace,size_t entropyWorkspaceSize)

{
  uint tableLog;
  size_t sVar1;
  ulong uVar2;
  ulong uVar3;
  void *ptr;
  size_t err_code;
  
  switch(type) {
  case set_basic:
    uVar3 = FSE_buildCTable_wksp
                      (nextCTable,defaultNorm,defaultMax,defaultNormLog,entropyWorkspace,
                       entropyWorkspaceSize);
    uVar2 = 0;
    break;
  case set_rle:
    *(undefined2 *)nextCTable = 0;
    *(short *)((long)nextCTable + 2) = (short)(max & 0xff);
    nextCTable[1] = 0;
    (nextCTable + (ulong)(max & 0xff) * 2 + 2)[0] = 0;
    (nextCTable + (ulong)(max & 0xff) * 2 + 2)[1] = 0;
    if (dstCapacity != 0) {
      *(BYTE *)dst = *codeTable;
      return 1;
    }
    return 0xffffffffffffffba;
  case set_compressed:
    tableLog = FSE_optimalTableLog_internal(FSELog,nbSeq,max,2);
    if (1 < count[codeTable[nbSeq - 1]]) {
      count[codeTable[nbSeq - 1]] = count[codeTable[nbSeq - 1]] - 1;
      nbSeq = nbSeq - 1;
    }
    if (nbSeq < 2) {
      __assert_fail("nbSeq_1 > 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x4c2e,
                    "size_t ZSTD_buildCTable(void *, size_t, FSE_CTable *, U32, symbolEncodingType_e, unsigned int *, U32, const BYTE *, size_t, const S16 *, U32, U32, const FSE_CTable *, size_t, void *, size_t)"
                   );
    }
    if (entropyWorkspaceSize < 0x4e0) {
      __assert_fail("entropyWorkspaceSize >= sizeof(ZSTD_BuildCTableWksp)",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x4c2f,
                    "size_t ZSTD_buildCTable(void *, size_t, FSE_CTable *, U32, symbolEncodingType_e, unsigned int *, U32, const BYTE *, size_t, const S16 *, U32, U32, const FSE_CTable *, size_t, void *, size_t)"
                   );
    }
    sVar1 = FSE_normalizeCount((short *)entropyWorkspace,tableLog,count,nbSeq,max,
                               (uint)(0x7ff < nbSeq));
    if (0xffffffffffffff88 < sVar1) {
      return sVar1;
    }
    if ((long)dstCapacity < 0) {
      __assert_fail("oend >= op",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x4c32,
                    "size_t ZSTD_buildCTable(void *, size_t, FSE_CTable *, U32, symbolEncodingType_e, unsigned int *, U32, const BYTE *, size_t, const S16 *, U32, U32, const FSE_CTable *, size_t, void *, size_t)"
                   );
    }
    uVar2 = FSE_writeNCount(dst,dstCapacity,(short *)entropyWorkspace,max,tableLog);
    if (0xffffffffffffff88 < uVar2) {
      return uVar2;
    }
    uVar3 = FSE_buildCTable_wksp
                      (nextCTable,(short *)entropyWorkspace,max,tableLog,
                       (void *)((long)entropyWorkspace + 0x6c),0x474);
    break;
  case set_repeat:
    memcpy(nextCTable,prevCTable,prevCTableSize);
    return 0;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x4c39,
                  "size_t ZSTD_buildCTable(void *, size_t, FSE_CTable *, U32, symbolEncodingType_e, unsigned int *, U32, const BYTE *, size_t, const S16 *, U32, U32, const FSE_CTable *, size_t, void *, size_t)"
                 );
  }
  if (0xffffffffffffff88 < uVar3) {
    uVar2 = uVar3;
  }
  return uVar2;
}

Assistant:

size_t
ZSTD_buildCTable(void* dst, size_t dstCapacity,
                FSE_CTable* nextCTable, U32 FSELog, symbolEncodingType_e type,
                unsigned* count, U32 max,
                const BYTE* codeTable, size_t nbSeq,
                const S16* defaultNorm, U32 defaultNormLog, U32 defaultMax,
                const FSE_CTable* prevCTable, size_t prevCTableSize,
                void* entropyWorkspace, size_t entropyWorkspaceSize)
{
    BYTE* op = (BYTE*)dst;
    const BYTE* const oend = op + dstCapacity;
    DEBUGLOG(6, "ZSTD_buildCTable (dstCapacity=%u)", (unsigned)dstCapacity);

    switch (type) {
    case set_rle:
        FORWARD_IF_ERROR(FSE_buildCTable_rle(nextCTable, (BYTE)max), "");
        RETURN_ERROR_IF(dstCapacity==0, dstSize_tooSmall, "not enough space");
        *op = codeTable[0];
        return 1;
    case set_repeat:
        ZSTD_memcpy(nextCTable, prevCTable, prevCTableSize);
        return 0;
    case set_basic:
        FORWARD_IF_ERROR(FSE_buildCTable_wksp(nextCTable, defaultNorm, defaultMax, defaultNormLog, entropyWorkspace, entropyWorkspaceSize), "");  /* note : could be pre-calculated */
        return 0;
    case set_compressed: {
        ZSTD_BuildCTableWksp* wksp = (ZSTD_BuildCTableWksp*)entropyWorkspace;
        size_t nbSeq_1 = nbSeq;
        const U32 tableLog = FSE_optimalTableLog(FSELog, nbSeq, max);
        if (count[codeTable[nbSeq-1]] > 1) {
            count[codeTable[nbSeq-1]]--;
            nbSeq_1--;
        }
        assert(nbSeq_1 > 1);
        assert(entropyWorkspaceSize >= sizeof(ZSTD_BuildCTableWksp));
        (void)entropyWorkspaceSize;
        FORWARD_IF_ERROR(FSE_normalizeCount(wksp->norm, tableLog, count, nbSeq_1, max, ZSTD_useLowProbCount(nbSeq_1)), "FSE_normalizeCount failed");
        assert(oend >= op);
        {   size_t const NCountSize = FSE_writeNCount(op, (size_t)(oend - op), wksp->norm, max, tableLog);   /* overflow protected */
            FORWARD_IF_ERROR(NCountSize, "FSE_writeNCount failed");
            FORWARD_IF_ERROR(FSE_buildCTable_wksp(nextCTable, wksp->norm, max, tableLog, wksp->wksp, sizeof(wksp->wksp)), "FSE_buildCTable_wksp failed");
            return NCountSize;
        }
    }
    default: assert(0); RETURN_ERROR(GENERIC, "impossible to reach");
    }
}